

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O0

LispPTR N_OP_fvarn(int n)

{
  DLword *achain;
  LispPTR *pLVar1;
  DLword *chain;
  int n_local;
  
  achain = MachineState.pvar + n;
  if ((*(ushort *)((ulong)achain ^ 2) & 1) != 0) {
    nfvlookup((frameex1 *)(MachineState.pvar + -10),achain,MachineState.currentfunc);
  }
  pLVar1 = NativeAligned4FromLAddr
                     (CONCAT22(*(undefined2 *)((ulong)(achain + 1) ^ 2),
                               *(undefined2 *)((ulong)achain ^ 2)) & 0xfffffff);
  return *pLVar1;
}

Assistant:

LispPTR N_OP_fvarn(int n)
/* n is word offset */

{
  DLword *chain; /* keep FVAR slot2 in CurrentFrameExtension */

  chain = PVar + n;

  if (WBITSPTR(chain)->LSB) {
    /* check 15bit of FVAR slot1 in CurrentFrameExtension.
       0: bound
       1: unbound */
    nfvlookup(CURRENTFX, chain, FuncObj);
  }

  return (GetLongWord(
      NativeAligned4FromLAddr(POINTERMASK & (((GETBASEWORD(chain, 1)) << 16) | GETBASEWORD(chain, 0)))));
}